

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_binary_arith_slow(JSContext *ctx,JSValue *sp,OPCodeEnum op)

{
  JSValue *pJVar1;
  double dVar2;
  double dVar3;
  int64_t iVar4;
  JSValue val;
  JSValue v;
  int iVar5;
  uint32_t tag;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint32_t tag_1;
  anon_union_8_2_94730072 u;
  double d2;
  double d1;
  double local_38;
  double local_30;
  
  dVar2 = sp[-2].u.float64;
  pJVar1 = sp + -1;
  dVar3 = (pJVar1->u).float64;
  iVar4 = sp[-1].tag;
  v = *pJVar1;
  val = *pJVar1;
  uVar6 = (uint)sp[-2].tag;
  if (uVar6 < 3) {
    dVar2 = (double)SUB84(dVar2,0);
LAB_0013afd3:
    local_30 = dVar2;
    uVar6 = (uint)iVar4;
    if (uVar6 < 3) {
      dVar3 = (double)SUB84(dVar3,0);
    }
    else if ((uVar6 != 7) &&
            (iVar5 = __JS_ToFloat64Free(ctx,&local_38,val), dVar3 = local_38, iVar5 != 0))
    goto LAB_0013b0f3;
    local_38 = dVar3;
    switch(op) {
    case OP_mul:
      local_30 = local_30 * local_38;
      break;
    case OP_div:
      local_30 = local_30 / local_38;
      break;
    case OP_mod:
      local_30 = fmod(local_30,local_38);
      break;
    default:
      abort();
    case OP_sub:
      local_30 = local_30 - local_38;
      break;
    case OP_pow:
      if ((((ulong)ABS(local_38) < 0x7ff0000000000000) || (ABS(local_30) != 1.0)) ||
         (NAN(ABS(local_30)))) {
        local_30 = pow(local_30,local_38);
      }
      else {
        local_30 = NAN;
      }
    }
    iVar5 = 0;
    uVar8 = (ulong)local_30 & 0xffffffff;
    uVar9 = (ulong)local_30 & 0xffffffff00000000;
    if (local_30 == (double)(int)local_30) {
      uVar8 = (ulong)(uint)(int)local_30;
      uVar9 = 0;
    }
    uVar7 = 7;
    if (local_30 == (double)(int)local_30) {
      uVar7 = 0;
    }
    sp[-2].u.ptr = (void *)(uVar8 | uVar9);
    sp[-2].tag = uVar7;
  }
  else {
    if ((uVar6 == 7) ||
       (iVar5 = __JS_ToFloat64Free(ctx,&local_30,sp[-2]), dVar2 = local_30, iVar5 == 0))
    goto LAB_0013afd3;
    JS_FreeValue(ctx,v);
LAB_0013b0f3:
    sp[-2].u.int32 = 0;
    sp[-2].tag = 3;
    sp[-1].u.int32 = 0;
    sp[-1].tag = 3;
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

int js_binary_arith_slow(JSContext *ctx, JSValue *sp,
                                                      OPCodeEnum op)
{
    JSValue op1, op2;
    double d1, d2, r;

    op1 = sp[-2];
    op2 = sp[-1];
    if (unlikely(JS_ToFloat64Free(ctx, &d1, op1))) {
        JS_FreeValue(ctx, op2);
        goto exception;
    }
    if (unlikely(JS_ToFloat64Free(ctx, &d2, op2))) {
        goto exception;
    }
    switch(op) {
    case OP_sub:
        r = d1 - d2;
        break;
    case OP_mul:
        r = d1 * d2;
        break;
    case OP_div:
        r = d1 / d2;
        break;
    case OP_mod:
        r = fmod(d1, d2);
        break;
    case OP_pow:
        r = js_pow(d1, d2);
        break;
    default:
        abort();
    }
    sp[-2] = JS_NewFloat64(ctx, r);
    return 0;
 exception:
    sp[-2] = JS_UNDEFINED;
    sp[-1] = JS_UNDEFINED;
    return -1;
}